

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

void LzmaEncProps_Normalize(CLzmaEncProps *p)

{
  int iVar1;
  int iVar2;
  UInt32 UVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = 5;
  if (-1 < p->level) {
    iVar1 = p->level;
  }
  p->level = iVar1;
  if (p->dictSize == 0) {
    if (iVar1 < 6) {
      UVar3 = 1 << ((char)iVar1 * '\x02' + 0xeU & 0x1f);
    }
    else {
      UVar3 = (uint)(iVar1 != 6) * 0x2000000 + 0x2000000;
    }
    p->dictSize = UVar3;
  }
  if (p->reduceSize < (ulong)p->dictSize) {
    iVar2 = 0xb;
    do {
      uVar5 = 2 << ((byte)iVar2 & 0x1f);
      uVar4 = (uint)p->reduceSize;
      if ((uVar4 <= uVar5) || (uVar5 = 3 << ((byte)iVar2 & 0x1f), uVar4 <= uVar5)) {
        p->dictSize = uVar5;
        break;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x1f);
  }
  if (p->lc < 0) {
    p->lc = 3;
  }
  if (p->lp < 0) {
    p->lp = 0;
  }
  if (p->pb < 0) {
    p->pb = 2;
  }
  if (p->algo < 0) {
    p->algo = (uint)(4 < iVar1);
  }
  if (p->fb < 0) {
    p->fb = (uint)(6 < iVar1) * 0x20 + 0x20;
  }
  if (p->btMode < 0) {
    p->btMode = (uint)(p->algo != 0);
  }
  if (p->numHashBytes < 0) {
    p->numHashBytes = 4;
  }
  if (p->mc == 0) {
    p->mc = (p->fb >> 1) + 0x10 >> (p->btMode == 0);
  }
  if (p->numThreads < 0) {
    p->numThreads = 1;
    return;
  }
  return;
}

Assistant:

void LzmaEncProps_Normalize(CLzmaEncProps *p)
{
  int level = p->level;
  if (level < 0) level = 5;
  p->level = level;
  
  if (p->dictSize == 0) p->dictSize = (level <= 5 ? (1 << (level * 2 + 14)) : (level == 6 ? (1 << 25) : (1 << 26)));
  if (p->dictSize > p->reduceSize)
  {
    unsigned i;
    for (i = 11; i <= 30; i++)
    {
      if ((UInt32)p->reduceSize <= ((UInt32)2 << i)) { p->dictSize = ((UInt32)2 << i); break; }
      if ((UInt32)p->reduceSize <= ((UInt32)3 << i)) { p->dictSize = ((UInt32)3 << i); break; }
    }
  }

  if (p->lc < 0) p->lc = 3;
  if (p->lp < 0) p->lp = 0;
  if (p->pb < 0) p->pb = 2;

  if (p->algo < 0) p->algo = (level < 5 ? 0 : 1);
  if (p->fb < 0) p->fb = (level < 7 ? 32 : 64);
  if (p->btMode < 0) p->btMode = (p->algo == 0 ? 0 : 1);
  if (p->numHashBytes < 0) p->numHashBytes = 4;
  if (p->mc == 0) p->mc = (16 + (p->fb >> 1)) >> (p->btMode ? 0 : 1);
  
  if (p->numThreads < 0)
    p->numThreads =
      #ifndef _7ZIP_ST
      ((p->btMode && p->algo) ? 2 : 1);
      #else
      1;
      #endif
}